

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasePort.cpp
# Opt level: O0

void __thiscall BasePort::SetDefaultProtocol(BasePort *this)

{
  bool bVar1;
  ostream *poVar2;
  BasePort *this_local;
  
  this->Protocol_ = PROTOCOL_SEQ_RW;
  if ((this->NumOfNodes_ != 0) && ((this->IsAllBoardsBroadcastCapable_ & 1U) != 0)) {
    bVar1 = IsBroadcastFirmwareMixValid(this);
    if (bVar1) {
      this->Protocol_ = PROTOCOL_SEQ_R_BC_W;
      bVar1 = IsBroadcastShorterWait(this);
      if (bVar1) {
        poVar2 = std::operator<<(this->outStr,
                                 "BasePort::SetDefaultProtocol: all nodes broadcast capable and support shorter wait"
                                );
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      }
      else if ((this->IsAllBoardsRev4_5_ & 1U) == 0) {
        if ((this->IsAllBoardsRev4_6_ & 1U) != 0) {
          poVar2 = std::operator<<(this->outStr,
                                   "BasePort::SetDefaultProtocol: all nodes broadcast capable and some support shorter wait"
                                  );
          std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        }
      }
      else {
        poVar2 = std::operator<<(this->outStr,
                                 "BasePort::SetDefaultProtocol: all nodes broadcast capable and do not support shorter wait"
                                );
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      }
    }
    else {
      poVar2 = std::operator<<(this->outStr,
                               "BasePort::SetDefaultProtocol: all nodes broadcast capable, but disabled due to mix of firmware"
                              );
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
  }
  return;
}

Assistant:

void BasePort::SetDefaultProtocol(void)
{
    Protocol_ = BasePort::PROTOCOL_SEQ_RW;
    // Use broadcast by default if all firmware are bc capable
    if ((NumOfNodes_ > 0) && IsAllBoardsBroadcastCapable_) {
        if (IsBroadcastFirmwareMixValid()) {
            Protocol_ = BasePort::PROTOCOL_SEQ_R_BC_W;
            if (IsBroadcastShorterWait())
                outStr << "BasePort::SetDefaultProtocol: all nodes broadcast capable and support shorter wait" << std::endl;
            else if (IsAllBoardsRev4_5_)
                outStr << "BasePort::SetDefaultProtocol: all nodes broadcast capable and do not support shorter wait" << std::endl;
            else if (IsAllBoardsRev4_6_)
                outStr << "BasePort::SetDefaultProtocol: all nodes broadcast capable and some support shorter wait" << std::endl;
        }
        else
            outStr << "BasePort::SetDefaultProtocol: all nodes broadcast capable, but disabled due to mix of firmware" << std::endl;
    }
}